

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O2

Ptr __thiscall soul::SourceCodeText::createForFile(SourceCodeText *this,string *file,string *text)

{
  SourceCodeText *this_00;
  string sStack_68;
  string local_48;
  
  this_00 = (SourceCodeText *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_48,(string *)file);
  std::__cxx11::string::string((string *)&sStack_68,(string *)text);
  SourceCodeText(this_00,&local_48,&sStack_68,false);
  *(SourceCodeText **)this = this_00;
  (this_00->super_RefCountedObject).refCount = (this_00->super_RefCountedObject).refCount + 1;
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return (Ptr)this;
}

Assistant:

SourceCodeText::Ptr SourceCodeText::createForFile (std::string file, std::string text)
{
    return Ptr (*new SourceCodeText (std::move (file), std::move (text), false));
}